

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O3

void __thiscall QFbCursor::updateMouseStatus(QFbCursor *this)

{
  long lVar1;
  DeviceType DVar2;
  int iVar3;
  long *plVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x50) == 0) {
    this[0x10] = (QFbCursor)0x0;
    plVar4 = *(long **)(this + 0x18);
  }
  else {
    DVar2 = QGuiApplicationPrivate::inputDeviceManager();
    iVar3 = QInputDeviceManager::deviceCount(DVar2);
    this[0x10] = (QFbCursor)(0 < iVar3);
    plVar4 = *(long **)(this + 0x18);
    if (0 < iVar3) {
      getCurrentRect(this);
      goto LAB_00111f93;
    }
  }
  (**(code **)(*(long *)this + 0xb8))(this);
LAB_00111f93:
  (**(code **)(*plVar4 + 0xd0))(plVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbCursor::updateMouseStatus()
{
    mVisible = mDeviceListener ? mDeviceListener->hasMouse() : false;
    mScreen->setDirty(mVisible ? getCurrentRect() : lastPainted());
}